

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::ARM::getDefaultFPU(ARM *this,StringRef CPU,ArchKind AK)

{
  char acVar1 [4];
  int iVar2;
  uint *puVar3;
  AlignedCharArray<4UL,_4UL> AVar4;
  byte bVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool local_4e;
  bool local_4d;
  bool local_4a;
  bool local_49;
  Optional<unsigned_int> local_38;
  
  pcVar6 = CPU.Data;
  if (pcVar6 == (char *)0x7) {
    iVar2 = bcmp(this,"generic",7);
    if (iVar2 == 0) {
      return *(uint *)(&DAT_001f5760 + (ulong)(uint)CPU.Length * 0x40);
    }
  }
  local_38.Storage.hasVal = false;
  if (pcVar6 == (char *)0x4) {
    if (*(int *)this == 0x326d7261) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar11 = true;
      goto LAB_0018aa35;
    }
    bVar12 = false;
    bVar11 = false;
    if (*(int *)this != 0x336d7261) goto LAB_0018aa3d;
LAB_0018aaed:
    local_38.Storage.hasVal = true;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
    bVar11 = true;
LAB_0018aaf9:
    bVar8 = pcVar6 != (char *)0xc;
    if (!bVar8 && !bVar11) {
      iVar2 = bcmp(this,"strongarm110",0xc);
      goto LAB_0018ab46;
    }
    bVar9 = pcVar6 != (char *)0xd;
    if ((bVar9 || bVar11) || (iVar2 = bcmp(this,"strongarm1100",0xd), iVar2 != 0))
    goto LAB_0018ab5d;
LAB_0018ac11:
    local_38.Storage.hasVal = true;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
    bVar11 = true;
LAB_0018ac1d:
    bVar10 = pcVar6 != (char *)0x7;
    if (((bVar10) || (bVar11)) || (iVar2 = bcmp(this,"arm710t",7), iVar2 != 0)) goto LAB_0018ac46;
LAB_0018b309:
    acVar1[0] = '\x01';
    acVar1[1] = '\0';
    acVar1[2] = '\0';
    acVar1[3] = '\0';
LAB_0018b30c:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)acVar1;
    local_38.Storage.hasVal = true;
  }
  else {
    bVar11 = false;
LAB_0018aa35:
    bVar12 = pcVar6 != (char *)0x4;
LAB_0018aa3d:
    if ((((!bVar12 && !bVar11) && (*(int *)this == 0x366d7261)) ||
        ((pcVar6 == (char *)0x5 && !bVar11 && (iVar2 = bcmp(this,"arm7m",5), iVar2 == 0)))) ||
       ((!bVar12 && !bVar11 && (*(int *)this == 0x386d7261)))) goto LAB_0018aaed;
    if (pcVar6 == (char *)0x6 && !bVar11) {
      iVar2 = bcmp(this,"arm810",6);
      if (iVar2 == 0) goto LAB_0018aaed;
      goto LAB_0018aaf9;
    }
    if (pcVar6 != (char *)0x9 || bVar11) goto LAB_0018aaf9;
    iVar2 = bcmp(this,"strongarm",9);
    bVar8 = true;
LAB_0018ab46:
    bVar9 = true;
    if (iVar2 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar11 = true;
    }
LAB_0018ab5d:
    if ((!bVar9 && !bVar11) && (iVar2 = bcmp(this,"strongarm1110",0xd), iVar2 == 0))
    goto LAB_0018ac11;
    if (pcVar6 == (char *)0x8 && !bVar11) {
      if (*(long *)this == 0x696d6474376d7261) goto LAB_0018ac11;
      goto LAB_0018ac1d;
    }
    if (pcVar6 != (char *)0xa || bVar11) goto LAB_0018ac1d;
    iVar2 = bcmp(this,"arm7tdmi-s",10);
    bVar10 = true;
    if (iVar2 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar11 = true;
    }
LAB_0018ac46:
    local_4a = pcVar6 == (char *)0xa;
    local_4d = pcVar6 == (char *)0x5;
    local_49 = pcVar6 == (char *)0x6;
    local_4e = pcVar6 == (char *)0x9;
    bVar7 = pcVar6 == (char *)0x8;
    if ((((((((!bVar10) && (!bVar11)) && (iVar2 = bcmp(this,"arm720t",7), iVar2 == 0)) ||
           ((!bVar12 && !bVar11 && (*(int *)this == 0x396d7261)))) ||
          (((bVar7 && !bVar11 && (*(long *)this == 0x696d6474396d7261)) ||
           ((local_49 && !bVar11 && (iVar2 = bcmp(this,"arm920",6), iVar2 == 0)))))) ||
         (((!bVar10 && !bVar11 && (iVar2 = bcmp(this,"arm920t",7), iVar2 == 0)) ||
          (((!bVar10 && !bVar11 && (iVar2 = bcmp(this,"arm922t",7), iVar2 == 0)) ||
           ((!bVar10 && !bVar11 && (iVar2 = bcmp(this,"arm9312",7), iVar2 == 0)))))))) ||
        ((((!bVar10 && !bVar11 && (iVar2 = bcmp(this,"arm940t",7), iVar2 == 0)) ||
          ((local_49 && !bVar11 && (iVar2 = bcmp(this,"ep9312",6), iVar2 == 0)))) ||
         ((((local_4e && !bVar11 && (iVar2 = bcmp(this,"arm10tdmi",9), iVar2 == 0)) ||
           ((bVar7 && !bVar11 && (*(long *)this == 0x74303230316d7261)))) ||
          ((((local_4d && !bVar11 && (iVar2 = bcmp(this,"arm9e",5), iVar2 == 0)) ||
            ((local_4e && !bVar11 && (iVar2 = bcmp(this,"arm946e-s",9), iVar2 == 0)))) ||
           ((((local_4e && !bVar11 && (iVar2 = bcmp(this,"arm966e-s",9), iVar2 == 0)) ||
             ((local_4e && !bVar11 && (iVar2 = bcmp(this,"arm968e-s",9), iVar2 == 0)))) ||
            ((local_49 && !bVar11 && (iVar2 = bcmp(this,"arm10e",6), iVar2 == 0)))))))))))) ||
       (((bVar7 && !bVar11 && (*(long *)this == 0x65303230316d7261)) ||
        ((((bVar7 && !bVar11 && (*(long *)this == 0x65323230316d7261)) ||
          ((local_4a && !bVar11 && (iVar2 = bcmp(this,"arm926ej-s",10), iVar2 == 0)))) ||
         ((local_4a && !bVar11 && (iVar2 = bcmp(this,"arm1136j-s",10), iVar2 == 0))))))))
    goto LAB_0018b309;
    acVar1[0] = '\x03';
    acVar1[1] = '\0';
    acVar1[2] = '\0';
    acVar1[3] = '\0';
    if ((pcVar6 == (char *)0xb) && ((!bVar11 && (iVar2 = bcmp(this,"arm1136jf-s",0xb), iVar2 == 0)))
       ) goto LAB_0018b30c;
    if ((((pcVar6 == (char *)0xb) &&
         ((!bVar11 && (iVar2 = bcmp(this,"arm1136jz-s",0xb), iVar2 == 0)))) ||
        ((local_4a && !bVar11 && (iVar2 = bcmp(this,"arm1176j-s",10), iVar2 == 0)))) ||
       (((pcVar6 == (char *)0xb && (!bVar11)) && (iVar2 = bcmp(this,"arm1176jz-s",0xb), iVar2 == 0))
       )) goto LAB_0018b309;
    if ((local_49 && !bVar11) && (iVar2 = bcmp(this,"mpcore",6), iVar2 == 0)) goto LAB_0018b30c;
    if ((pcVar6 == (char *)0xb) && ((!bVar11 && (iVar2 = bcmp(this,"mpcorenovfp",0xb), iVar2 == 0)))
       ) goto LAB_0018b309;
    if ((!bVar8 && !bVar11) && (iVar2 = bcmp(this,"arm1176jzf-s",0xc), iVar2 == 0))
    goto LAB_0018b30c;
    if (((pcVar6 == (char *)0xb) && (!bVar11)) && (iVar2 = bcmp(this,"arm1156t2-s",0xb), iVar2 == 0)
       ) goto LAB_0018b309;
    if ((!bVar8 && !bVar11) && (iVar2 = bcmp(this,"arm1156t2f-s",0xc), iVar2 == 0))
    goto LAB_0018b30c;
    if (((((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-m0",9), iVar2 == 0)) ||
         ((!bVar9 && !bVar11 && (iVar2 = bcmp(this,"cortex-m0plus",0xd), iVar2 == 0)))) ||
        ((local_4e && !bVar11 && (iVar2 = bcmp(this,"cortex-m1",9), iVar2 == 0)))) ||
       ((local_4d && !bVar11 && (iVar2 = bcmp(this,"sc000",5), iVar2 == 0)))) goto LAB_0018b309;
    if (((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-a5",9), iVar2 == 0)) ||
       ((local_4e && !bVar11 && (iVar2 = bcmp(this,"cortex-a7",9), iVar2 == 0)))) {
LAB_0018b634:
      acVar1[0] = '\x12';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if ((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-a8",9), iVar2 == 0)) {
      acVar1[0] = '\x10';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if ((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-a9",9), iVar2 == 0)) {
      acVar1[0] = '\x11';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if ((((local_4a && !bVar11) && (iVar2 = bcmp(this,"cortex-a12",10), iVar2 == 0)) ||
        ((local_4a && !bVar11 && (iVar2 = bcmp(this,"cortex-a15",10), iVar2 == 0)))) ||
       (((local_4a && !bVar11 && (iVar2 = bcmp(this,"cortex-a17",10), iVar2 == 0)) ||
        ((local_4d && !bVar11 && (iVar2 = bcmp(this,"krait",5), iVar2 == 0)))))) goto LAB_0018b634;
    if ((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-r4",9), iVar2 == 0)) goto LAB_0018b309;
    acVar1[0] = '\x06';
    acVar1[1] = '\0';
    acVar1[2] = '\0';
    acVar1[3] = '\0';
    if ((((local_4a && !bVar11) && (iVar2 = bcmp(this,"cortex-r4f",10), iVar2 == 0)) ||
        (((local_4e && !bVar11 && (iVar2 = bcmp(this,"cortex-r5",9), iVar2 == 0)) ||
         ((acVar1[0] = '\a', acVar1[1] = '\0', acVar1[2] = '\0', acVar1[3] = '\0',
          local_4e && !bVar11 && (iVar2 = bcmp(this,"cortex-r7",9), iVar2 == 0)))))) ||
       ((local_4e && !bVar11 && (iVar2 = bcmp(this,"cortex-r8",9), iVar2 == 0)))) goto LAB_0018b30c;
    if ((local_4a && !bVar11) && (iVar2 = bcmp(this,"cortex-r52",10), iVar2 == 0)) {
      acVar1[0] = '\x13';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if (((local_4d && !bVar11) && (iVar2 = bcmp(this,"sc300",5), iVar2 == 0)) ||
       ((local_4e && !bVar11 && (iVar2 = bcmp(this,"cortex-m3",9), iVar2 == 0)))) goto LAB_0018b309;
    if ((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-m4",9), iVar2 == 0)) {
      acVar1[0] = '\f';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if ((local_4e && !bVar11) && (iVar2 = bcmp(this,"cortex-m7",9), iVar2 == 0)) {
      acVar1[0] = '\r';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if ((local_4a && !bVar11) && (iVar2 = bcmp(this,"cortex-m23",10), iVar2 == 0))
    goto LAB_0018b309;
    if ((local_4a && !bVar11) && (iVar2 = bcmp(this,"cortex-m33",10), iVar2 == 0)) {
      acVar1[0] = '\x0e';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
    if ((local_4a && !bVar11) && (iVar2 = bcmp(this,"cortex-a32",10), iVar2 == 0)) {
      acVar1[0] = '\x14';
      acVar1[1] = '\0';
      acVar1[2] = '\0';
      acVar1[3] = '\0';
      goto LAB_0018b30c;
    }
  }
  bVar5 = local_38.Storage.hasVal;
  AVar4.buffer[0] = '\x01';
  AVar4.buffer[1] = '\0';
  AVar4.buffer[2] = '\0';
  AVar4.buffer[3] = '\0';
  if ((((((pcVar6 == (char *)0xa && local_38.Storage.hasVal == false) &&
         (iVar2 = bcmp(this,"cortex-a35",10), iVar2 == 0)) ||
        ((pcVar6 == (char *)0xa && (bool)bVar5 == false &&
         (iVar2 = bcmp(this,"cortex-a53",10), iVar2 == 0)))) ||
       ((pcVar6 == (char *)0xa && (bool)bVar5 == false &&
        (iVar2 = bcmp(this,"cortex-a55",10), iVar2 == 0)))) ||
      ((pcVar6 == (char *)0xa && (bool)bVar5 == false &&
       (iVar2 = bcmp(this,"cortex-a57",10), iVar2 == 0)))) ||
     (((pcVar6 == (char *)0xa && (bool)bVar5 == false &&
       (iVar2 = bcmp(this,"cortex-a72",10), iVar2 == 0)) ||
      ((pcVar6 == (char *)0xa && (bool)bVar5 == false &&
       (iVar2 = bcmp(this,"cortex-a73",10), iVar2 == 0)))))) {
    bVar11 = true;
LAB_0018b45c:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x14;
    local_38.Storage.hasVal = true;
    bVar12 = true;
    bVar5 = 1;
LAB_0018b46f:
    if ((((!bVar12 && (bVar5 & 1) == 0) && (iVar2 = bcmp(this,"exynos-m2",9), iVar2 == 0)) ||
        ((!bVar12 && (bVar5 & 1) == 0 && (iVar2 = bcmp(this,"exynos-m3",9), iVar2 == 0)))) ||
       ((!bVar12 && (bVar5 & 1) == 0 && (iVar2 = bcmp(this,"exynos-m4",9), iVar2 == 0))))
    goto LAB_0018b515;
    if (pcVar6 == (char *)0x4 && bVar5 == 0) {
      if (*(int *)this == 0x6f79726b) goto LAB_0018b515;
      goto LAB_0018b52d;
    }
    if ((bVar5 != 0 || pcVar6 != (char *)0x6) || (iVar2 = bcmp(this,"iwmmxt",6), iVar2 != 0))
    goto LAB_0018b52d;
  }
  else {
    if (pcVar6 == (char *)0xa && (bool)bVar5 == false) {
      iVar2 = bcmp(this,"cortex-a75",10);
      bVar11 = true;
LAB_0018b624:
      bVar12 = true;
      if (iVar2 == 0) goto LAB_0018b45c;
      goto LAB_0018b46f;
    }
    bVar11 = pcVar6 != (char *)0x7;
    if ((bool)bVar5 == false && !bVar11) {
      iVar2 = bcmp(this,"cyclone",7);
      goto LAB_0018b624;
    }
    bVar12 = pcVar6 != (char *)0x9;
    if (((bool)bVar5 != false || bVar12) || (iVar2 = bcmp(this,"exynos-m1",9), iVar2 != 0))
    goto LAB_0018b46f;
LAB_0018b515:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x14;
    local_38.Storage.hasVal = true;
    bVar5 = 1;
LAB_0018b52d:
    if ((pcVar6 != (char *)0x6 || (bVar5 & 1) != 0) || (iVar2 = bcmp(this,"xscale",6), iVar2 != 0))
    {
      if ((pcVar6 == (char *)0x5 && bVar5 == 0) && (iVar2 = bcmp(this,"swift",5), iVar2 == 0)) {
        AVar4.buffer[0] = '\x12';
        AVar4.buffer[1] = '\0';
        AVar4.buffer[2] = '\0';
        AVar4.buffer[3] = '\0';
      }
      else {
        if ((bVar11 || (bVar5 & 1) != 0) || (iVar2 = bcmp(this,"invalid",7), iVar2 != 0)) {
          if (bVar5 == 0) {
            return 0;
          }
          goto LAB_0018b5f5;
        }
        AVar4.buffer[0] = '\0';
        AVar4.buffer[1] = '\0';
        AVar4.buffer[2] = '\0';
        AVar4.buffer[3] = '\0';
      }
    }
  }
  local_38.Storage.hasVal = true;
  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar4.buffer;
LAB_0018b5f5:
  puVar3 = Optional<unsigned_int>::getPointer(&local_38);
  return *puVar3;
}

Assistant:

unsigned llvm::ARM::getDefaultFPU(StringRef CPU, ArchKind AK) {
  if (CPU == "generic")
    return ARCHNames[static_cast<unsigned>(AK)].DefaultFPU;

  return StringSwitch<unsigned>(CPU)
#define ARM_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT) \
    .Case(NAME, DEFAULT_FPU)
#include "llvm/Support/ARMTargetParser.def"
    .Default(ARM::FK_INVALID);
}